

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::BindReservoirQuantileDecimal
          (ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  pointer pEVar1;
  long in_RDX;
  AggregateFunction *in_RDI;
  PhysicalType in_stack_0000005f;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_00000138;
  AggregateFunction *in_stack_00000140;
  ClientContext *in_stack_00000148;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *bind_data;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> this;
  
  this._M_head_impl = (FunctionData *)in_RDI;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_RDI,(size_type)in_RDI);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)this._M_head_impl);
  LogicalType::InternalType((LogicalType *)(pEVar1 + 0x38));
  GetReservoirQuantileAggregateFunction(in_stack_0000005f);
  AggregateFunction::operator=((AggregateFunction *)this._M_head_impl,in_RDI);
  AggregateFunction::~AggregateFunction((AggregateFunction *)this._M_head_impl);
  BindReservoirQuantile(in_stack_00000148,in_stack_00000140,in_stack_00000138);
  std::__cxx11::string::operator=((string *)(in_RDX + 8),"reservoir_quantile");
  *(code **)(in_RDX + 0x108) = ReservoirQuantileBindData::Serialize;
  *(code **)(in_RDX + 0x110) = ReservoirQuantileBindData::Deserialize;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         this._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> BindReservoirQuantileDecimal(ClientContext &context, AggregateFunction &function,
                                                      vector<unique_ptr<Expression>> &arguments) {
	function = GetReservoirQuantileAggregateFunction(arguments[0]->return_type.InternalType());
	auto bind_data = BindReservoirQuantile(context, function, arguments);
	function.name = "reservoir_quantile";
	function.serialize = ReservoirQuantileBindData::Serialize;
	function.deserialize = ReservoirQuantileBindData::Deserialize;
	return bind_data;
}